

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void __thiscall QGraphicsWidget::setWindowFrameMargins(QGraphicsWidget *this,QMarginsF margins)

{
  QGraphicsWidgetPrivate *this_00;
  bool bVar1;
  type pQVar2;
  
  this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
  if (((this_00->windowFrameMargins)._M_t.
       super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
       super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
       super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl == (QMarginsF *)0x0) &&
     (bVar1 = QMarginsF::isNull(&margins), bVar1)) {
    return;
  }
  QGraphicsWidgetPrivate::ensureWindowFrameMargins(this_00);
  pQVar2 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator*
                     (&this_00->windowFrameMargins);
  bVar1 = qFuzzyCompare(pQVar2,&margins);
  if ((!bVar1) || (this_00->setWindowFrameMargins == false)) {
    if (!bVar1) {
      QGraphicsItem::prepareGeometryChange((QGraphicsItem *)(this + 0x10));
    }
    pQVar2 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator*
                       (&this_00->windowFrameMargins);
    pQVar2->m_left = margins.m_left;
    pQVar2->m_top = margins.m_top;
    pQVar2->m_right = margins.m_right;
    pQVar2->m_bottom = margins.m_bottom;
    this_00->setWindowFrameMargins = true;
  }
  return;
}

Assistant:

void QGraphicsWidget::setWindowFrameMargins(QMarginsF margins)
{
    Q_D(QGraphicsWidget);

    if (!d->windowFrameMargins && margins.isNull())
        return;
    d->ensureWindowFrameMargins();
    const bool unchanged = *d->windowFrameMargins == margins;
    if (d->setWindowFrameMargins && unchanged)
        return;
    if (!unchanged)
        prepareGeometryChange();
    *d->windowFrameMargins = margins;
    d->setWindowFrameMargins = true;
}